

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<InterfaceVariableRename,_8UL>::push_back
          (SmallVector<InterfaceVariableRename,_8UL> *this,InterfaceVariableRename *t)

{
  size_t *psVar1;
  
  reserve(this,(this->super_VectorView<InterfaceVariableRename>).buffer_size + 1);
  InterfaceVariableRename::InterfaceVariableRename
            ((this->super_VectorView<InterfaceVariableRename>).ptr +
             (this->super_VectorView<InterfaceVariableRename>).buffer_size,t);
  psVar1 = &(this->super_VectorView<InterfaceVariableRename>).buffer_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}